

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_class_dice(parser *p)

{
  _Bool _Var1;
  void *pvVar2;
  long lVar3;
  dice_t *dice_00;
  char *string_00;
  char *string;
  dice_t *dice;
  effect *effect;
  class_spell *spell;
  class_book *book;
  player_class *c;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (*(int *)((long)pvVar2 + 0xf8) < 1) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    if ((*(long *)((long)pvVar2 + 0x100) == 0) ||
       (class_max_books < *(wchar_t *)((long)pvVar2 + 0xf8))) {
      __assert_fail("c->magic.books && c->magic.num_books <= class_max_books",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/init.c"
                    ,0xf4e,"enum parser_error parse_class_dice(struct parser *)");
    }
    lVar3 = *(long *)((long)pvVar2 + 0x100) + (long)(*(int *)((long)pvVar2 + 0xf8) + -1) * 0x20;
    if (*(int *)(lVar3 + 0xc) < 1) {
      p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else {
      if ((*(long *)(lVar3 + 0x18) == 0) || (book_max_spells < *(wchar_t *)(lVar3 + 0xc))) {
        __assert_fail("book->spells && book->num_spells <= book_max_spells",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/init.c"
                      ,0xf54,"enum parser_error parse_class_dice(struct parser *)");
      }
      dice = *(dice_t **)
              (*(long *)(lVar3 + 0x18) + (long)(*(int *)(lVar3 + 0xc) + -1) * 0x38 + 0x10);
      if (dice == (dice_t *)0x0) {
        p_local._4_4_ = PARSE_ERROR_NONE;
      }
      else {
        for (; lVar3._0_4_ = dice->b, lVar3._4_4_ = dice->x, lVar3 != 0; dice = *(dice_t **)dice) {
        }
        dice_00 = dice_new();
        if (dice_00 == (dice_t *)0x0) {
          p_local._4_4_ = PARSE_ERROR_INVALID_DICE;
        }
        else {
          string_00 = parser_getstr(p,"dice");
          _Var1 = dice_parse_string(dice_00,string_00);
          if (_Var1) {
            dice_free(*(dice_t **)&dice->ex_b);
            *(dice_t **)&dice->ex_b = dice_00;
            p_local._4_4_ = PARSE_ERROR_NONE;
          }
          else {
            dice_free(dice_00);
            p_local._4_4_ = PARSE_ERROR_INVALID_DICE;
          }
        }
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_class_dice(struct parser *p) {
	struct player_class *c = parser_priv(p);
	struct class_book *book;
	struct class_spell *spell;
	struct effect *effect;
	dice_t *dice;
	const char *string;

	if (!c) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (c->magic.num_books < 1) {
		/*
		 * Either missing a magic directive for the class or didn't
		 * have a book directive after the magic directive.
		 */
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	assert(c->magic.books && c->magic.num_books <= class_max_books);
	book = &c->magic.books[c->magic.num_books - 1];
	if (book->num_spells < 1) {
		/* Missing a spell directive after the book directive. */
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	assert(book->spells && book->num_spells <= book_max_spells);
	spell = &book->spells[book->num_spells - 1];
	/* If there is no effect, assume that this is human and not parser error. */
	effect = spell->effect;
	if (effect == NULL) {
		return PARSE_ERROR_NONE;
	}
	while (effect->next) effect = effect->next;

	dice = dice_new();
	if (dice == NULL) {
		return PARSE_ERROR_INVALID_DICE;
	}

	string = parser_getstr(p, "dice");
	if (dice_parse_string(dice, string)) {
		dice_free(effect->dice);
		effect->dice = dice;
	} else {
		dice_free(dice);
		return PARSE_ERROR_INVALID_DICE;
	}

	return PARSE_ERROR_NONE;
}